

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O1

int main(void)

{
  pointer *ppPVar1;
  bool bVar2;
  undefined8 this;
  char cVar3;
  int iVar4;
  VideoCapture cap;
  Mat frame;
  HandDetector hd;
  Mat mask;
  Mat img;
  Mat imgYCrCb;
  Mat blur;
  int local_580;
  int local_57c;
  _InputArray local_570;
  pointer local_558;
  pointer local_550;
  undefined1 local_548 [104];
  pointer local_4e0;
  Scalar local_4d8;
  double local_4b8;
  double local_4b0;
  double local_4a8;
  double local_4a0;
  Scalar local_498;
  VideoCapture local_478 [48];
  undefined1 local_448 [96];
  HandDetector local_3e8;
  Mat local_2d0 [96];
  undefined1 local_270 [192];
  Mat local_1b0 [96];
  Mat local_150 [96];
  Mat local_f0 [96];
  Mat local_90 [96];
  
  HandDetector::HandDetector((HandDetector *)(local_448 + 0x60));
  cv::VideoCapture::VideoCapture(local_478,0,0);
  cVar3 = cv::VideoCapture::isOpened();
  if (cVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot open video capture",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
    std::ostream::put('\b');
    iVar4 = 1;
    std::ostream::flush();
  }
  else {
    cv::Mat::Mat((Mat *)local_448);
    cv::Mat::Mat((Mat *)local_270);
    cv::Mat::Mat(local_150);
    cv::Mat::Mat(local_1b0);
    cv::Mat::Mat(local_2d0);
    cv::createBackgroundSubtractorMOG2((int)local_548,16.0,true);
    this = local_548._8_8_;
    local_4e0 = (pointer)local_548._0_8_;
    local_57c = 100;
    local_580 = 1;
    do {
      cVar3 = cv::VideoCapture::isOpened();
      if (cVar3 == '\0') break;
      cv::VideoCapture::operator>>(local_478,(Mat *)local_448);
      local_548._16_8_ = (pointer)0x0;
      local_548._0_4_ = 0x1010000;
      local_570.sz.width = 0;
      local_570.sz.height = 0;
      local_570.flags = 0x2010000;
      local_570.obj = (pointer)local_448;
      local_548._8_8_ = (pointer)local_448;
      cv::flip((_InputArray *)local_548,(_OutputArray *)&local_570,0);
      local_548._16_8_ = (pointer)0x0;
      local_548._0_4_ = 0x1010000;
      local_570.sz.width = 0;
      local_570.sz.height = 0;
      local_570.flags = 0x2010000;
      local_570.obj = (pointer)local_448;
      local_548._8_8_ = (pointer)local_448;
      cv::flip((_InputArray *)local_548,(_OutputArray *)&local_570,1);
      cv::Mat::Mat((Mat *)(local_270 + 0x60),(Mat *)local_448);
      local_558 = local_4e0;
      if ((pointer)this != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ppPVar1 = &(((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)this)->
                     super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl
                     .super__Vector_impl_data._M_finish;
          *(int *)ppPVar1 = *(int *)ppPVar1 + 1;
          UNLOCK();
        }
        else {
          ppPVar1 = &(((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)this)->
                     super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl
                     .super__Vector_impl_data._M_finish;
          *(int *)ppPVar1 = *(int *)ppPVar1 + 1;
        }
      }
      iVar4 = local_580;
      local_550 = (pointer)this;
      deleteBg(local_90,(Mat *)(local_270 + 0x60),(Ptr<cv::BackgroundSubtractor> *)local_270,
               SUB81(&local_558,0),local_580);
      cv::Mat::~Mat(local_90);
      if (local_550 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_550);
      }
      cv::Mat::~Mat((Mat *)(local_270 + 0x60));
      local_548._16_8_ = (pointer)0x0;
      local_548._0_4_ = 0x1010000;
      local_548._8_8_ = local_270;
      local_570.sz.width = 0;
      local_570.sz.height = 0;
      local_570.flags = 0x2010000;
      local_570.obj = local_1b0;
      cv::cvtColor((cv *)local_548,&local_570,(_OutputArray *)0x24,0,iVar4);
      cv::Mat::Mat(local_f0,local_1b0);
      local_498.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.0;
      local_498.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 135.0;
      local_498.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 90.0;
      local_498.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
      local_4b8 = 255.0;
      local_4b0 = 230.0;
      local_4a8 = 150.0;
      local_4a0 = 0.0;
      HandDetector::detectHands_range
                ((HandDetector *)local_548,(Mat *)(local_448 + 0x60),(Scalar *)local_f0,&local_498);
      cv::Mat::operator=(local_2d0,(Mat *)local_548);
      cv::Mat::~Mat((Mat *)local_548);
      cv::Mat::~Mat(local_f0);
      HandDetector::getFingers((HandDetector *)(local_448 + 0x60));
      HandDetector::initFilters((HandDetector *)(local_448 + 0x60));
      HandDetector::updateFilters((HandDetector *)(local_448 + 0x60));
      HandDetector::stabilize((HandDetector *)(local_448 + 0x60));
      HandDetector::getHigherFingers((HandDetector *)(local_448 + 0x60));
      HandDetector::getFarthestFingers((HandDetector *)(local_448 + 0x60));
      local_4d8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 255.0;
      local_4d8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 0.0;
      local_4d8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 100.0;
      local_4d8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
      HandDetector::drawHands((HandDetector *)(local_448 + 0x60),(Mat *)local_448,&local_4d8,2);
      local_548._0_8_ = local_548 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"hands","");
      local_570.sz.width = 0;
      local_570.sz.height = 0;
      local_570.flags = 0x1010000;
      local_570.obj = local_448;
      cv::imshow((string *)local_548,&local_570);
      if ((pointer)local_548._0_8_ != (pointer)(local_548 + 0x10)) {
        operator_delete((void *)local_548._0_8_);
      }
      local_548._0_8_ = local_548 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"mask","");
      local_570.sz.width = 0;
      local_570.sz.height = 0;
      local_570.flags = 0x1010000;
      local_570.obj = local_2d0;
      cv::imshow((string *)local_548,&local_570);
      if ((pointer)local_548._0_8_ != (pointer)(local_548 + 0x10)) {
        operator_delete((void *)local_548._0_8_);
      }
      HandDetector::updateLast((HandDetector *)(local_448 + 0x60));
      if (local_57c < 1) {
        if (local_580 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Background learned",0x12);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
          std::ostream::put(-0x60);
          std::ostream::flush();
          local_580 = 0;
        }
      }
      else {
        local_57c = local_57c + -1;
      }
      cVar3 = cv::waitKey(1);
      bVar2 = true;
      if (cVar3 != -1) {
        if (cVar3 == 'b') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Starting learning background.",0x1d);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
          std::ostream::put(-0x60);
          std::ostream::flush();
          local_57c = 100;
          bVar2 = true;
          local_580 = 1;
        }
        else if (cVar3 == 'q') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"exit",4);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
          std::ostream::put(-0x60);
          std::ostream::flush();
          bVar2 = false;
        }
        else {
          printf("Key pressed: %c\n");
        }
      }
    } while (bVar2);
    if ((pointer)this != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
    }
    cv::Mat::~Mat(local_2d0);
    cv::Mat::~Mat(local_1b0);
    cv::Mat::~Mat(local_150);
    cv::Mat::~Mat((Mat *)local_270);
    cv::Mat::~Mat((Mat *)local_448);
    iVar4 = 0;
  }
  cv::VideoCapture::~VideoCapture(local_478);
  std::vector<ShortHand,_std::allocator<ShortHand>_>::~vector(&local_3e8.lastHands);
  std::
  vector<std::vector<Filter,_std::allocator<Filter>_>,_std::allocator<std::vector<Filter,_std::allocator<Filter>_>_>_>
  ::~vector(&local_3e8.filters);
  cv::CascadeClassifier::~CascadeClassifier(&local_3e8.cascade);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8.cascadePath._M_dataplus._M_p != &local_3e8.cascadePath.field_2) {
    operator_delete(local_3e8.cascadePath._M_dataplus._M_p);
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_3e8.contours);
  std::vector<Hand,_std::allocator<Hand>_>::~vector
            ((vector<Hand,_std::allocator<Hand>_> *)(local_448 + 0x60));
  return iVar4;
}

Assistant:

int main()
{
    HandDetector hd;
    VideoCapture cap(0);
    if (!cap.isOpened()) {
        cerr << "Cannot open video capture" << endl;
        return EXIT_FAILURE;
    }

    Mat frame, img, blur, imgYCrCb, mask;

    Scalar lower = Scalar(0, 135, 90);
    Scalar upper = Scalar(255, 230, 150);

    Ptr<BackgroundSubtractor> bgs = createBackgroundSubtractorMOG2();
    bool bgs_learn = true;
    int bgs_learnNFrames = 100;

    while (cap.isOpened()) {
        cap >> frame;
        flip(frame, frame, 0);
        flip(frame, frame, 1);

        deleteBg(frame, img, bgs, bgs_learn, hd.thresh_sens_val);
        cvtColor(img, imgYCrCb, COLOR_BGR2YCrCb);
        mask = hd.detectHands_range(imgYCrCb, lower, upper);
        hd.getFingers();

        hd.initFilters();
        hd.updateFilters();
        hd.stabilize();

        hd.getHigherFingers();
        hd.getFarthestFingers();

        hd.drawHands(frame, Scalar(255, 0, 100), 2);

        imshow("hands", frame);
        imshow("mask", mask);

        hd.updateLast();

        if (bgs_learnNFrames > 0)
            bgs_learnNFrames--;
        else if (bgs_learn) {
            bgs_learn = false;
            cout << "Background learned" << endl;
        }

        char key = waitKey(1);
        if (key != -1) {
            switch (key) {
                case 'q': // exit
                    cout << "exit" << endl;
                    return EXIT_SUCCESS;
                case 'b': // change bg
                    bgs_learnNFrames = 100;
                    bgs_learn = true;
                    cout << "Starting learning background." << endl;
                    break;
                default:
                    printf("Key pressed: %c\n", key);
                    break;
            }
        }
    }
    return EXIT_SUCCESS;
}